

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool __thiscall
testing::internal::FloatingPoint<double>::AlmostEquals
          (FloatingPoint<double> *this,FloatingPoint<double> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (this->u_).bits_;
  if (((~uVar1 & 0x7ff0000000000000) != 0 || (uVar1 & 0xfffffffffffff) == 0) &&
     (uVar3 = (rhs->u_).bits_, (~uVar3 & 0x7ff0000000000000) != 0 || (uVar3 & 0xfffffffffffff) == 0)
     ) {
    uVar2 = uVar1 | 0x8000000000000000;
    if ((long)uVar1 < 0) {
      uVar2 = -uVar1;
    }
    uVar1 = uVar3 | 0x8000000000000000;
    if ((long)uVar3 < 0) {
      uVar1 = -uVar3;
    }
    uVar3 = uVar2 - uVar1;
    if (uVar2 < uVar1) {
      uVar3 = -(uVar2 - uVar1);
    }
    return uVar3 < 5;
  }
  return false;
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
    // The IEEE standard says that any comparison operation involving
    // a NAN must return false.
    if (is_nan() || rhs.is_nan()) return false;

    return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
        <= kMaxUlps;
  }